

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::App(App *this,string *description_,string *name)

{
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  string local_60;
  string local_40;
  string *local_20;
  string *name_local;
  string *description__local;
  App *this_local;
  
  local_20 = name;
  name_local = description_;
  description__local = (string *)this;
  ::std::__cxx11::string::string((string *)&local_40,(string *)description_);
  ::std::__cxx11::string::string((string *)&local_60,(string *)name);
  App(this,&local_40,&local_60,(App *)0x0);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"-h,--help",&local_91);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"Print this help message and exit",&local_b9);
  set_help_flag(this,&local_90,&local_b8);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
  return;
}

Assistant:

explicit App(std::string description_ = "", std::string name = "") : App(description_, name, nullptr) {
        set_help_flag("-h,--help", "Print this help message and exit");
    }